

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::i2p_connection::
on_name_lookup<std::function<void(boost::system::error_code_const&,char_const*)>>
          (i2p_connection *this,error_code *ec,shared_ptr<libtorrent::i2p_stream> *param_2,
          function<void_(const_boost::system::error_code_&,_const_char_*)> *handler)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  string name;
  _Any_data local_68;
  _List_node_base *local_58;
  _List_node_base *local_50;
  char *local_40 [4];
  
  this->m_state = sam_idle;
  ::std::__cxx11::string::string
            ((string *)local_40,
             (string *)
             &((this->m_sam_socket).
               super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_name_lookup);
  p_Var1 = (this->m_name_lookup).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->m_name_lookup) {
    local_68._M_unused._M_object = (_List_node_base *)0x0;
    local_68._8_8_ = (_List_node_base *)0x0;
    local_58 = (_List_node_base *)0x0;
    local_50 = p_Var1[4]._M_prev;
    p_Var2 = p_Var1[4]._M_next;
    if (p_Var2 != (_List_node_base *)0x0) {
      local_68._M_unused._M_object = p_Var1[3]._M_next;
      local_68._8_8_ = p_Var1[3]._M_prev;
      p_Var1[4]._M_next = (_List_node_base *)0x0;
      p_Var1[4]._M_prev = (_List_node_base *)0x0;
      local_58 = p_Var2;
    }
    do_name_lookup<std::function<void(boost::system::error_code_const&,char_const*)>>
              (this,(string *)(p_Var1 + 1),
               (function<void_(const_boost::system::error_code_&,_const_char_*)> *)&local_68);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
    ::std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
    ::pop_front(&this->m_name_lookup);
  }
  if (ec->failed_ != false) {
    local_40[0] = (char *)0x0;
  }
  ::std::function<void_(const_boost::system::error_code_&,_const_char_*)>::operator()
            (handler,ec,local_40[0]);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void on_name_lookup(error_code const& ec, std::shared_ptr<i2p_stream>, Handler handler)
	{
		m_state = sam_idle;

		std::string name = m_sam_socket->name_lookup();
		if (!m_name_lookup.empty())
		{
			std::pair<std::string, name_lookup_handler>& nl = m_name_lookup.front();
			do_name_lookup(nl.first, std::move(nl.second));
			m_name_lookup.pop_front();
		}

		if (ec)
		{
			handler(ec, nullptr);
			return;
		}

		handler(ec, name.c_str());
	}